

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcsample.c
# Opt level: O2

void h2v2_downsample(j_compress_ptr cinfo,jpeg_component_info *compptr,JSAMPARRAY input_data,
                    JSAMPARRAY output_data)

{
  JSAMPROW pJVar1;
  JSAMPROW pJVar2;
  JSAMPROW pJVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  
  iVar8 = compptr->DCT_h_scaled_size * compptr->width_in_blocks;
  expand_right_edge(input_data,cinfo->max_v_samp_factor,cinfo->image_width,iVar8 * 2);
  lVar5 = 0;
  for (lVar4 = 0; lVar4 < cinfo->max_v_samp_factor; lVar4 = lVar4 + 2) {
    pJVar1 = output_data[lVar5];
    pJVar2 = input_data[lVar4];
    pJVar3 = input_data[lVar4 + 1];
    uVar7 = 1;
    for (lVar6 = 0; iVar8 != (int)lVar6; lVar6 = lVar6 + 1) {
      pJVar1[lVar6] =
           (JSAMPLE)(pJVar2[lVar6 * 2] + uVar7 +
                     (uint)pJVar3[lVar6 * 2] + (uint)pJVar2[lVar6 * 2 + 1] +
                     (uint)pJVar3[lVar6 * 2 + 1] >> 2);
      uVar7 = uVar7 ^ 3;
    }
    lVar5 = lVar5 + 1;
  }
  return;
}

Assistant:

METHODDEF(void)
h2v2_downsample (j_compress_ptr cinfo, jpeg_component_info * compptr,
		 JSAMPARRAY input_data, JSAMPARRAY output_data)
{
  int inrow, outrow;
  JDIMENSION outcol;
  JDIMENSION output_cols = compptr->width_in_blocks * compptr->DCT_h_scaled_size;
  register JSAMPROW inptr0, inptr1, outptr;
  register int bias;

  /* Expand input data enough to let all the output samples be generated
   * by the standard loop.  Special-casing padded output would be more
   * efficient.
   */
  expand_right_edge(input_data, cinfo->max_v_samp_factor,
		    cinfo->image_width, output_cols * 2);

  inrow = outrow = 0;
  while (inrow < cinfo->max_v_samp_factor) {
    outptr = output_data[outrow];
    inptr0 = input_data[inrow];
    inptr1 = input_data[inrow+1];
    bias = 1;			/* bias = 1,2,1,2,... for successive samples */
    for (outcol = 0; outcol < output_cols; outcol++) {
      *outptr++ = (JSAMPLE) ((GETJSAMPLE(*inptr0) + GETJSAMPLE(inptr0[1]) +
			      GETJSAMPLE(*inptr1) + GETJSAMPLE(inptr1[1])
			      + bias) >> 2);
      bias ^= 3;		/* 1=>2, 2=>1 */
      inptr0 += 2; inptr1 += 2;
    }
    inrow += 2;
    outrow++;
  }
}